

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_get_table_cb(void *pArg,int nCol,char **argv,char **colv)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  char *pcVar4;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  long *in_RDI;
  int n;
  char **azNew;
  char *z;
  int i;
  int need;
  TabResult *p;
  char *in_stack_ffffffffffffffa8;
  int iVar5;
  
  iVar5 = in_ESI;
  if ((*(int *)((long)in_RDI + 0x14) == 0) && (in_RDX != 0)) {
    iVar5 = in_ESI << 1;
  }
  if (*(uint *)(in_RDI + 2) < (uint)(*(int *)((long)in_RDI + 0x1c) + iVar5)) {
    *(int *)(in_RDI + 2) = (int)in_RDI[2] * 2 + iVar5;
    pvVar3 = sqlite3Realloc((void *)CONCAT44(iVar5,0xaaaaaaaa),0xaaaaaaaaaaaaaaaa);
    if (pvVar3 == (void *)0x0) {
LAB_00146b33:
      *(undefined4 *)(in_RDI + 4) = 7;
      return 1;
    }
    *in_RDI = (long)pvVar3;
  }
  if (*(int *)((long)in_RDI + 0x14) == 0) {
    *(int *)(in_RDI + 3) = in_ESI;
    for (iVar5 = 0; iVar5 < in_ESI; iVar5 = iVar5 + 1) {
      pcVar4 = sqlite3_mprintf("%s",*(undefined8 *)(in_RCX + (long)iVar5 * 8));
      if (pcVar4 == (char *)0x0) goto LAB_00146b33;
      uVar1 = *(uint *)((long)in_RDI + 0x1c);
      *(uint *)((long)in_RDI + 0x1c) = uVar1 + 1;
      *(char **)(*in_RDI + (ulong)uVar1 * 8) = pcVar4;
    }
  }
  else if ((int)in_RDI[3] != in_ESI) {
    sqlite3_free((void *)0x146a25);
    pcVar4 = sqlite3_mprintf("sqlite3_get_table() called with two or more incompatible queries");
    in_RDI[1] = (long)pcVar4;
    *(undefined4 *)(in_RDI + 4) = 1;
    return 1;
  }
  if (in_RDX != 0) {
    for (iVar5 = 0; iVar5 < in_ESI; iVar5 = iVar5 + 1) {
      if (*(long *)(in_RDX + (long)iVar5 * 8) == 0) {
        pvVar3 = (void *)0x0;
      }
      else {
        iVar2 = sqlite3Strlen30(in_stack_ffffffffffffffa8);
        pvVar3 = sqlite3_malloc64((sqlite3_uint64)in_stack_ffffffffffffffa8);
        if (pvVar3 == (void *)0x0) goto LAB_00146b33;
        memcpy(pvVar3,*(void **)(in_RDX + (long)iVar5 * 8),(long)(iVar2 + 1));
      }
      uVar1 = *(uint *)((long)in_RDI + 0x1c);
      *(uint *)((long)in_RDI + 0x1c) = uVar1 + 1;
      *(void **)(*in_RDI + (ulong)uVar1 * 8) = pvVar3;
    }
    *(int *)((long)in_RDI + 0x14) = *(int *)((long)in_RDI + 0x14) + 1;
  }
  return 0;
}

Assistant:

static int sqlite3_get_table_cb(void *pArg, int nCol, char **argv, char **colv){
  TabResult *p = (TabResult*)pArg;  /* Result accumulator */
  int need;                         /* Slots needed in p->azResult[] */
  int i;                            /* Loop counter */
  char *z;                          /* A single column of result */

  /* Make sure there is enough space in p->azResult to hold everything
  ** we need to remember from this invocation of the callback.
  */
  if( p->nRow==0 && argv!=0 ){
    need = nCol*2;
  }else{
    need = nCol;
  }
  if( p->nData + need > p->nAlloc ){
    char **azNew;
    p->nAlloc = p->nAlloc*2 + need;
    azNew = sqlite3Realloc( p->azResult, sizeof(char*)*p->nAlloc );
    if( azNew==0 ) goto malloc_failed;
    p->azResult = azNew;
  }

  /* If this is the first row, then generate an extra row containing
  ** the names of all columns.
  */
  if( p->nRow==0 ){
    p->nColumn = nCol;
    for(i=0; i<nCol; i++){
      z = sqlite3_mprintf("%s", colv[i]);
      if( z==0 ) goto malloc_failed;
      p->azResult[p->nData++] = z;
    }
  }else if( (int)p->nColumn!=nCol ){
    sqlite3_free(p->zErrMsg);
    p->zErrMsg = sqlite3_mprintf(
       "sqlite3_get_table() called with two or more incompatible queries"
    );
    p->rc = SQLITE_ERROR;
    return 1;
  }

  /* Copy over the row data
  */
  if( argv!=0 ){
    for(i=0; i<nCol; i++){
      if( argv[i]==0 ){
        z = 0;
      }else{
        int n = sqlite3Strlen30(argv[i])+1;
        z = sqlite3_malloc64( n );
        if( z==0 ) goto malloc_failed;
        memcpy(z, argv[i], n);
      }
      p->azResult[p->nData++] = z;
    }
    p->nRow++;
  }
  return 0;

malloc_failed:
  p->rc = SQLITE_NOMEM_BKPT;
  return 1;
}